

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O3

void __thiscall
ImportSource_createImportSource_Test::TestBody(ImportSource_createImportSource_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ImportSourcePtr imp1;
  long *local_38;
  AssertHelper local_30 [8];
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  shared_ptr<libcellml::ImportSource> local_18;
  
  libcellml::ImportSource::create();
  local_38 = (long *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_28,"nullptr","imp1",&local_38,&local_18);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_30);
    if (local_38 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_38 != (long *)0x0)) {
        (**(code **)(*local_38 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(ImportSource, createImportSource)
{
    auto imp1 = libcellml::ImportSource::create();
    EXPECT_NE(nullptr, imp1);
}